

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O1

void __thiscall
ModelFlattening_flatteningMediumBondGraph_Test::~ModelFlattening_flatteningMediumBondGraph_Test
          (ModelFlattening_flatteningMediumBondGraph_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ModelFlattening, flatteningMediumBondGraph)
{
    auto importer = libcellml::Importer::create(false);
    auto parser = libcellml::Parser::create(false);

    auto model = parser->parseModel(fileContents("importer/mediumbondgraph/cpp_coupling.cellml"));
    importer->resolveImports(model, resourcePath("importer/mediumbondgraph"));

    auto flatModel = importer->flattenModel(model);
    EXPECT_EQ("C_main_vessel", flatModel->component(0)->variable(0)->name());
    EXPECT_EQ(size_t(1), flatModel->component(0)->variable(0)->equivalentVariableCount());
    EXPECT_EQ("C", flatModel->component(2)->variable(1)->name());
    EXPECT_EQ(size_t(2), flatModel->component(2)->variable(1)->equivalentVariableCount());
}